

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int maybe_bind_socket(int fd)

{
  int iVar1;
  int *piVar2;
  socklen_t slen;
  uv__sockaddr s;
  socklen_t local_3c;
  sockaddr local_38;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  local_3c = 0x1c;
  local_38.sa_family = 0;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  uStack_28 = 0;
  uStack_24 = 0;
  iVar1 = getsockname(fd,&local_38,&local_3c);
  if (iVar1 == 0) {
    if (((local_38.sa_family & 0xfff7) == 2) && (local_38.sa_data._0_2_ != 0)) {
      return 0;
    }
    iVar1 = bind(fd,&local_38,local_3c);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

static int maybe_bind_socket(int fd) {
  union uv__sockaddr s;
  socklen_t slen;

  slen = sizeof(s);
  memset(&s, 0, sizeof(s));

  if (getsockname(fd, &s.addr, &slen))
    return UV__ERR(errno);

  if (s.addr.sa_family == AF_INET)
    if (s.in.sin_port != 0)
      return 0;  /* Already bound to a port. */

  if (s.addr.sa_family == AF_INET6)
    if (s.in6.sin6_port != 0)
      return 0;  /* Already bound to a port. */

  /* Bind to an arbitrary port. */
  if (bind(fd, &s.addr, slen))
    return UV__ERR(errno);

  return 0;
}